

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void realloc_strncat(char **str,char *append,size_t len)

{
  void *__dest;
  uint *puVar1;
  size_t in_RDX;
  void *in_RSI;
  long *in_RDI;
  size_t old_len;
  char *new_str;
  size_t local_28;
  
  if (*in_RDI == 0) {
    local_28 = 0;
  }
  else {
    local_28 = strlen((char *)*in_RDI);
  }
  __dest = malloc(local_28 + in_RDX + 1);
  if (__dest == (void *)0x0) {
    puVar1 = (uint *)__errno_location();
    lafe_errc(1,(int)(ulong)*puVar1,"Out of memory");
  }
  if (*in_RDI != 0) {
    memcpy(__dest,(void *)*in_RDI,local_28);
  }
  memcpy((void *)((long)__dest + local_28),in_RSI,in_RDX);
  *(undefined1 *)((long)__dest + local_28 + in_RDX) = 0;
  free((void *)*in_RDI);
  *in_RDI = (long)__dest;
  return;
}

Assistant:

static void
realloc_strncat(char **str, const char *append, size_t len)
{
	char *new_str;
	size_t old_len;

	if (*str == NULL)
		old_len = 0;
	else
		old_len = strlen(*str);

	new_str = malloc(old_len + len + 1);
	if (new_str == NULL)
		lafe_errc(1, errno, "Out of memory");
	if (*str != NULL)
		memcpy(new_str, *str, old_len);
	memcpy(new_str + old_len, append, len);
	new_str[old_len + len] = '\0';
	free(*str);
	*str = new_str;
}